

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O0

void __thiscall tcmalloc::GenericWriter::AppendMem(GenericWriter *this,char *str,size_t sz)

{
  int iVar1;
  unsigned_long *puVar2;
  int *piVar3;
  undefined4 extraout_var;
  tuple<char*&,char*&> local_58 [16];
  pair<char_*,_char_*> local_48;
  int local_34;
  unsigned_long local_30;
  int local_24;
  size_t sStack_20;
  int amount;
  size_t sz_local;
  char *str_local;
  GenericWriter *this_local;
  
  sStack_20 = sz;
  sz_local = (size_t)str;
  str_local = (char *)this;
  while( true ) {
    iVar1 = std::numeric_limits<int>::max();
    local_30 = (unsigned_long)iVar1;
    puVar2 = std::min<unsigned_long>(&local_30,&stack0xffffffffffffffe0);
    local_24 = (int)*puVar2;
    local_34 = (int)this->buf_end_ - (int)this->buf_fill_;
    piVar3 = std::min<int>(&local_24,&local_34);
    local_24 = *piVar3;
    if (local_24 != 0) {
      memcpy(this->buf_fill_,(void *)sz_local,(long)local_24);
    }
    sz_local = sz_local + (long)local_24;
    this->buf_fill_ = this->buf_fill_ + local_24;
    sStack_20 = sStack_20 - (long)local_24;
    if (sStack_20 == 0) break;
    iVar1 = (*this->_vptr_GenericWriter[2])(this,this->buf_,this->buf_fill_,1);
    local_48.first = (char *)CONCAT44(extraout_var,iVar1);
    std::tie<char*,char*>((char **)local_58,&this->buf_);
    std::tuple<char*&,char*&>::operator=(local_58,&local_48);
    this->buf_fill_ = this->buf_;
  }
  return;
}

Assistant:

void GenericWriter::AppendMem(const char* str, size_t sz) {
  for (;;) {
    // first, cap amount to be at most MAX_INT
    int amount = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), sz));
    amount = std::min<int>(amount, buf_end_ - buf_fill_);

    // So this is silly but ultimately harmless. Glibc defines memcpy
    // args to be non-null (so, even for the amount == 0 case). And
    // while in practice it works (and has to), ubsan kinda complains.
    //
    // Thankfully in this place we can afford slight perf hit of doing
    // "stupid" thing.
    if (PREDICT_TRUE(amount != 0)) {
      memcpy(buf_fill_, str, amount);
    }

    str += amount;
    buf_fill_ += amount;
    sz -= amount;

    if (sz == 0) {
      return;
    }

    std::tie(buf_, buf_end_) = RecycleBuffer(buf_, buf_fill_, 1);
    buf_fill_ = buf_;
  }
}